

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall Table::measureCell(Table *this,string *data,uint *minimum,uint *maximum)

{
  uint uVar1;
  string local_48 [8];
  string stripped;
  uint *maximum_local;
  uint *minimum_local;
  string *data_local;
  Table *this_local;
  
  Color::strip((Color *)local_48,data);
  uVar1 = longestLine(local_48);
  *maximum = uVar1;
  uVar1 = longestWord(local_48);
  *minimum = uVar1;
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Table::measureCell (
  const std::string& data,
  unsigned int& minimum,
  unsigned int& maximum) const
{
  std::string stripped = Color::strip (data);
  maximum = longestLine (stripped);
  minimum = longestWord (stripped);
}